

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# operations.cpp
# Opt level: O0

error_code
anon_unknown.dwarf_522f::dir_itr_increment
          (void **handle,void **buffer,string *target,file_status *sf,file_status *symlink_sf)

{
  int val;
  int *piVar1;
  error_category *cat;
  file_status *pfVar2;
  error_code eVar3;
  file_status local_84;
  file_status local_7c;
  file_status local_74;
  file_status local_6c;
  file_status local_64;
  file_status local_5c;
  int local_54;
  dirent *pdStack_50;
  int return_code;
  dirent *result;
  dirent *entry;
  file_status *symlink_sf_local;
  file_status *sf_local;
  string *target_local;
  void **buffer_local;
  void **handle_local;
  error_category *local_10;
  
  entry = (dirent *)symlink_sf;
  symlink_sf_local = sf;
  sf_local = (file_status *)target;
  target_local = (string *)buffer;
  buffer_local = handle;
  if (*buffer == (void *)0x0) {
    __assert_fail("buffer != 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/Naios[P]boost-minimal-dist/libs/filesystem/src/operations.cpp"
                  ,0x825,
                  "error_code (anonymous namespace)::dir_itr_increment(void *&, void *&, string &, fs::file_status &, fs::file_status &)"
                 );
  }
  result = (dirent *)*buffer;
  local_54 = readdir_r_simulator((DIR *)*handle,result,&stack0xffffffffffffffb0);
  if (local_54 == 0) {
    if (pdStack_50 == (dirent *)0x0) {
      eVar3 = boost::filesystem::detail::dir_itr_close(buffer_local,(void **)target_local);
      local_10 = eVar3.m_cat;
      handle_local = (void **)(ulong)(uint)eVar3.m_val;
    }
    else {
      std::__cxx11::string::operator=((string *)sf_local,result->d_name);
      if (result->d_type == '\0') {
        boost::filesystem::file_status::file_status(&local_5c,status_error);
        pfVar2 = boost::filesystem::file_status::operator=((file_status *)entry,&local_5c);
        boost::filesystem::file_status::operator=(symlink_sf_local,pfVar2);
      }
      else if (result->d_type == '\x04') {
        boost::filesystem::file_status::file_status(&local_64,directory_file);
        pfVar2 = boost::filesystem::file_status::operator=((file_status *)entry,&local_64);
        boost::filesystem::file_status::operator=(symlink_sf_local,pfVar2);
      }
      else if (result->d_type == '\b') {
        boost::filesystem::file_status::file_status(&local_6c,regular_file);
        pfVar2 = boost::filesystem::file_status::operator=((file_status *)entry,&local_6c);
        boost::filesystem::file_status::operator=(symlink_sf_local,pfVar2);
      }
      else if (result->d_type == '\n') {
        boost::filesystem::file_status::file_status(&local_74,status_error);
        boost::filesystem::file_status::operator=(symlink_sf_local,&local_74);
        boost::filesystem::file_status::file_status(&local_7c,symlink_file);
        boost::filesystem::file_status::operator=((file_status *)entry,&local_7c);
      }
      else {
        boost::filesystem::file_status::file_status(&local_84,status_error);
        pfVar2 = boost::filesystem::file_status::operator=((file_status *)entry,&local_84);
        boost::filesystem::file_status::operator=(symlink_sf_local,pfVar2);
      }
      handle_local = (anonymous_namespace)::ok;
      local_10 = DAT_00129410;
    }
  }
  else {
    piVar1 = __errno_location();
    val = *piVar1;
    cat = boost::system::system_category();
    boost::system::error_code::error_code((error_code *)&handle_local,val,cat);
  }
  eVar3._0_8_ = (ulong)handle_local & 0xffffffff;
  eVar3.m_cat = local_10;
  return eVar3;
}

Assistant:

error_code dir_itr_increment(void *& handle, void *& buffer,
    string& target, fs::file_status & sf, fs::file_status & symlink_sf)
  {
    BOOST_ASSERT(buffer != 0);
    dirent * entry(static_cast<dirent *>(buffer));
    dirent * result;
    int return_code;
    if ((return_code = readdir_r_simulator(static_cast<DIR*>(handle), entry, &result))!= 0)
      return error_code(errno, system_category());
    if (result == 0)
      return fs::detail::dir_itr_close(handle, buffer);
    target = entry->d_name;
#   ifdef BOOST_FILESYSTEM_STATUS_CACHE
    if (entry->d_type == DT_UNKNOWN) // filesystem does not supply d_type value
    {
      sf = symlink_sf = fs::file_status(fs::status_error);
    }
    else  // filesystem supplies d_type value
    {
      if (entry->d_type == DT_DIR)
        sf = symlink_sf = fs::file_status(fs::directory_file);
      else if (entry->d_type == DT_REG)
        sf = symlink_sf = fs::file_status(fs::regular_file);
      else if (entry->d_type == DT_LNK)
      {
        sf = fs::file_status(fs::status_error);
        symlink_sf = fs::file_status(fs::symlink_file);
      }
      else sf = symlink_sf = fs::file_status(fs::status_error);
    }
#   else
    sf = symlink_sf = fs::file_status(fs::status_error);
#    endif
    return ok;
  }